

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcoluj.c
# Opt level: O0

int ffpclujj(fitsfile *fptr,int colnum,LONGLONG firstrow,LONGLONG firstelem,LONGLONG nelem,
            ULONGLONG *array,int *status)

{
  int iVar1;
  size_t sVar2;
  long local_7278;
  long local_7270;
  void *buffer;
  double cbuff [3600];
  char snull [20];
  size_t formlen;
  char message [81];
  char acStack_129 [9];
  char cform [20];
  char local_108 [8];
  char tform [20];
  double local_e8;
  double zero;
  double scale;
  LONGLONG tnull;
  LONGLONG next;
  LONGLONG remain;
  LONGLONG rownum;
  LONGLONG rowlen;
  LONGLONG wrtptr;
  LONGLONG elemnum;
  LONGLONG startpos;
  LONGLONG repeat;
  long ntodo;
  long incre;
  long twidth;
  int local_70;
  int hdutype;
  int maxelem;
  int tcode;
  ULONGLONG *array_local;
  LONGLONG nelem_local;
  LONGLONG firstelem_local;
  LONGLONG firstrow_local;
  fitsfile *pfStack_40;
  int colnum_local;
  fitsfile *fptr_local;
  
  if (*status < 1) {
    _maxelem = array;
    array_local = (ULONGLONG *)nelem;
    nelem_local = firstelem;
    firstelem_local = firstrow;
    firstrow_local._4_4_ = colnum;
    pfStack_40 = fptr;
    iVar1 = ffgcprll(fptr,colnum,firstrow,firstelem,nelem,1,&zero,&local_e8,local_108,&incre,
                     &hdutype,&local_70,&elemnum,&wrtptr,&ntodo,&startpos,&rownum,
                     (int *)((long)&twidth + 4),(LONGLONG *)&scale,(char *)(cbuff + 0xe0f),status);
    if (iVar1 < 1) {
      if (hdutype == 0x10) {
        ffcfmt(local_108,acStack_129 + 1);
      }
      next = (LONGLONG)array_local;
      tnull = 0;
      remain = 0;
      while (next != 0) {
        if (next < local_70) {
          local_7270 = next;
        }
        else {
          local_7270 = (long)local_70;
        }
        if (local_7270 < startpos - wrtptr) {
          local_7278 = local_7270;
        }
        else {
          local_7278 = startpos - wrtptr;
        }
        repeat = local_7278;
        rowlen = elemnum + remain * rownum + wrtptr * ntodo;
        ffmbyt(pfStack_40,rowlen,1,status);
        if (hdutype == 0xb) {
          ffu8fi1(_maxelem + tnull,repeat,zero,local_e8,(uchar *)&buffer,status);
          ffpi1b(pfStack_40,repeat,ntodo,(uchar *)&buffer,status);
        }
        else if (hdutype == 0x10) {
          sVar2 = strlen(acStack_129 + 1);
          if (((twidth._4_4_ != 1) || (sVar2 < 2)) ||
             ((acStack_129[sVar2] != 'f' && (acStack_129[sVar2] != 'E')))) {
LAB_00262117:
            snprintf((char *)&formlen,0x51,"Cannot write numbers to column %d which has format %s",
                     (ulong)firstrow_local._4_4_,local_108);
            ffpmsg((char *)&formlen);
            if (twidth._4_4_ == 1) {
              *status = 0x137;
              return 0x137;
            }
            *status = 0x138;
            return 0x138;
          }
          ffu8fstr(_maxelem + tnull,repeat,zero,local_e8,acStack_129 + 1,incre,(char *)&buffer,
                   status);
          if (ntodo == incre) {
            ffpbyt(pfStack_40,repeat * incre,&buffer,status);
          }
          else {
            ffpbytoff(pfStack_40,incre,repeat,ntodo - incre,&buffer,status);
          }
        }
        else if (hdutype == 0x15) {
          ffu8fi2(_maxelem + tnull,repeat,zero,local_e8,(short *)&buffer,status);
          ffpi2b(pfStack_40,repeat,ntodo,(short *)&buffer,status);
        }
        else if (hdutype == 0x29) {
          ffu8fi4(_maxelem + tnull,repeat,zero,local_e8,(int *)&buffer,status);
          ffpi4b(pfStack_40,repeat,ntodo,(int *)&buffer,status);
        }
        else if (hdutype == 0x2a) {
          ffu8fr4(_maxelem + tnull,repeat,zero,local_e8,(float *)&buffer,status);
          ffpr4b(pfStack_40,repeat,ntodo,(float *)&buffer,status);
        }
        else if (hdutype == 0x51) {
          ffu8fi8(_maxelem + tnull,repeat,zero,local_e8,(LONGLONG *)&buffer,status);
          ffpi8b(pfStack_40,repeat,ntodo,(long *)&buffer,status);
        }
        else {
          if (hdutype != 0x52) goto LAB_00262117;
          ffu8fr8(_maxelem + tnull,repeat,zero,local_e8,(double *)&buffer,status);
          ffpr8b(pfStack_40,repeat,ntodo,(double *)&buffer,status);
        }
        if (0 < *status) {
          snprintf((char *)&formlen,0x51,
                   "Error writing elements %.0f thru %.0f of input data array (ffpcluj).",
                   (double)(tnull + 1),(double)(tnull + repeat));
          ffpmsg((char *)&formlen);
          return *status;
        }
        next = next - repeat;
        if (next != 0) {
          tnull = repeat + tnull;
          wrtptr = repeat + wrtptr;
          if (wrtptr == startpos) {
            wrtptr = 0;
            remain = remain + 1;
          }
        }
      }
      if (*status == -0xb) {
        ffpmsg("Numerical overflow during type conversion while writing FITS data.");
        *status = 0x19c;
      }
      fptr_local._4_4_ = *status;
    }
    else {
      fptr_local._4_4_ = *status;
    }
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffpclujj( fitsfile *fptr,  /* I - FITS file pointer                       */
            int  colnum,     /* I - number of column to write (1 = 1st col) */
            LONGLONG  firstrow,  /* I - first row to write (1 = 1st row)        */
            LONGLONG  firstelem, /* I - first vector element to write (1 = 1st) */
            LONGLONG  nelem,     /* I - number of values to write               */
            ULONGLONG  *array,    /* I - array of values to write                */
            int  *status)    /* IO - error status                           */
/*
  Write an array of values to a column in the current FITS HDU.
  The column number may refer to a real column in an ASCII or binary table, 
  or it may refer to a virtual column in a 1 or more grouped FITS primary
  array.  FITSIO treats a primary array as a binary table
  with 2 vector columns: the first column contains the group parameters (often
  with length = 0) and the second column contains the array of image pixels.
  Each row of the table represents a group in the case of multigroup FITS
  images.

  The input array of values will be converted to the datatype of the column 
  and will be inverse-scaled by the FITS TSCALn and TZEROn values if necessary.
*/
{
    int tcode, maxelem, hdutype;
    long twidth, incre;
    long ntodo;
    LONGLONG repeat, startpos, elemnum, wrtptr, rowlen, rownum, remain, next, tnull;
    double scale, zero;
    char tform[20], cform[20];
    char message[FLEN_ERRMSG];
    size_t formlen;

    char snull[20];   /*  the FITS null value  */

    double cbuff[DBUFFSIZE / sizeof(double)]; /* align cbuff on word boundary */
    void *buffer;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    buffer = cbuff;

    /*---------------------------------------------------*/
    /*  Check input and get parameters about the column: */
    /*---------------------------------------------------*/
    if (ffgcprll( fptr, colnum, firstrow, firstelem, nelem, 1, &scale, &zero,
        tform, &twidth, &tcode, &maxelem, &startpos,  &elemnum, &incre,
        &repeat, &rowlen, &hdutype, &tnull, snull, status) > 0)
        return(*status);

    if (tcode == TSTRING)   
         ffcfmt(tform, cform);     /* derive C format for writing strings */

    /*---------------------------------------------------------------------*/
    /*  Now write the pixels to the FITS column.                           */
    /*  First call the ffXXfYY routine to  (1) convert the datatype        */
    /*  if necessary, and (2) scale the values by the FITS TSCALn and      */
    /*  TZEROn linear scaling parameters into a temporary buffer.          */
    /*---------------------------------------------------------------------*/
    remain = nelem;           /* remaining number of values to write  */
    next = 0;                 /* next element in array to be written  */
    rownum = 0;               /* row number, relative to firstrow     */

    while (remain)
    {
        /* limit the number of pixels to process a one time to the number that
           will fit in the buffer space or to the number of pixels that remain
           in the current vector, which ever is smaller.
        */
        ntodo = (long) minvalue(remain, maxelem);      
        ntodo = (long) minvalue(ntodo, (repeat - elemnum));

        wrtptr = startpos + ((LONGLONG)rownum * rowlen) + (elemnum * incre);

        ffmbyt(fptr, wrtptr, IGNORE_EOF, status); /* move to write position */

        switch (tcode) 
        {
            case (TLONGLONG):

                ffu8fi8(&array[next], ntodo, scale, zero,
                        (LONGLONG *) buffer, status);
                ffpi8b(fptr, ntodo, incre, (long *) buffer, status);
                break;

            case (TLONG):

                ffu8fi4(&array[next], ntodo, scale, zero,
                      (INT32BIT *) buffer, status);
                ffpi4b(fptr, ntodo, incre, (INT32BIT *) buffer, status);
                break;

            case (TBYTE):
 
                ffu8fi1(&array[next], ntodo, scale, zero,
                        (unsigned char *) buffer, status);
                ffpi1b(fptr, ntodo, incre, (unsigned char *) buffer, status);
                break;

            case (TSHORT):

                ffu8fi2(&array[next], ntodo, scale, zero,
                        (short *) buffer, status);
                ffpi2b(fptr, ntodo, incre, (short *) buffer, status);
                break;

            case (TFLOAT):

                ffu8fr4(&array[next], ntodo, scale, zero,
                        (float *) buffer, status);
                ffpr4b(fptr, ntodo, incre, (float *) buffer, status);
                break;

            case (TDOUBLE):
                ffu8fr8(&array[next], ntodo, scale, zero,
                       (double *) buffer, status);
                ffpr8b(fptr, ntodo, incre, (double *) buffer, status);
                break;

            case (TSTRING):  /* numerical column in an ASCII table */

                formlen = strlen(cform);
                if (hdutype == ASCII_TBL && formlen > 1)
                {
                   if (cform[formlen-1] == 'f' || cform[formlen-1] == 'E')
                   {
                     ffu8fstr(&array[next], ntodo, scale, zero, cform,
                             twidth, (char *) buffer, status);

                     if (incre == twidth)    /* contiguous bytes */
                        ffpbyt(fptr, ntodo * twidth, buffer, status);
                     else
                        ffpbytoff(fptr, twidth, ntodo, incre - twidth, buffer,
                               status);

                     break;
                   }
                }
                /* can't write to string column, so fall thru to default: */

            default:  /*  error trap  */
                snprintf(message, FLEN_ERRMSG,
                     "Cannot write numbers to column %d which has format %s",
                      colnum,tform);
                ffpmsg(message);
                if (hdutype == ASCII_TBL)
                    return(*status = BAD_ATABLE_FORMAT);
                else
                    return(*status = BAD_BTABLE_FORMAT);

        } /* End of switch block */

        /*-------------------------*/
        /*  Check for fatal error  */
        /*-------------------------*/
        if (*status > 0)  /* test for error during previous write operation */
        {
          snprintf(message, FLEN_ERRMSG,
          "Error writing elements %.0f thru %.0f of input data array (ffpcluj).",
              (double) (next+1), (double) (next+ntodo));
          ffpmsg(message);
          return(*status);
        }

        /*--------------------------------------------*/
        /*  increment the counters for the next loop  */
        /*--------------------------------------------*/
        remain -= ntodo;
        if (remain)
        {
            next += ntodo;
            elemnum += ntodo;
            if (elemnum == repeat)  /* completed a row; start on next row */
            {
                elemnum = 0;
                rownum++;
            }
        }
    }  /*  End of main while Loop  */


    /*--------------------------------*/
    /*  check for numerical overflow  */
    /*--------------------------------*/
    if (*status == OVERFLOW_ERR)
    {
        ffpmsg(
        "Numerical overflow during type conversion while writing FITS data.");
        *status = NUM_OVERFLOW;
    }

    return(*status);
}